

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemory.c
# Opt level: O0

char * deStrdup(char *str)

{
  char *pcVar1;
  char *str_local;
  
  pcVar1 = strdup(str);
  return pcVar1;
}

Assistant:

char* deStrdup (const char* str)
{
#if (DE_COMPILER == DE_COMPILER_MSC)
	return _strdup(str);
#elif (DE_OS == DE_OS_OSX) || (DE_OS == DE_OS_IOS)
	/* For some reason Steve doesn't like stdrup(). */
	size_t	len		= strlen(str);
	char*	copy	= malloc(len+1);
	memcpy(copy, str, len);
	copy[len] = 0;
	return copy;
#else
	return strdup(str);
#endif
}